

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_0U>::overlap_iterator::
setToBegin(overlap_iterator *this)

{
  bool bVar1;
  const_iterator *in_RDI;
  interval<unsigned_long> *in_stack_00000008;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>_>
  *in_stack_00000018;
  overlap_iterator *in_stack_00000040;
  uint32_t in_stack_ffffffffffffffec;
  
  bVar1 = const_iterator::isFlat(in_RDI);
  if (bVar1) {
    IntervalMapDetails::
    NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true>_>
    ::findFirstOverlap(in_stack_00000018,this._4_4_,(uint32_t)this,in_stack_00000008);
    const_iterator::setRoot(in_RDI,in_stack_ffffffffffffffec);
  }
  else {
    IntervalMapDetails::
    NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>::
    findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>
                      *)in_stack_00000018,this._4_4_,(uint32_t)this,in_stack_00000008);
    const_iterator::setRoot(in_RDI,in_stack_ffffffffffffffec);
    treeFind(in_stack_00000040);
  }
  return;
}

Assistant:

void setToBegin() {
        if (this->isFlat()) {
            this->setRoot(this->map->rootLeaf.findFirstOverlap(0, this->map->rootSize, searchKey));
        }
        else {
            this->setRoot(
                this->map->rootBranch.findFirstOverlap(0, this->map->rootSize, searchKey));
            treeFind();
        }
    }